

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O1

void Abc_NtkVerifyReportErrorSeq(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int *pModel,int nFrames)

{
  Abc_NtkType_t AVar1;
  Abc_NtkType_t AVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Abc_Obj_t *pAVar6;
  void *pvVar7;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *pVVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  Abc_Obj_t *pObj;
  ulong uVar15;
  Abc_Ntk_t *local_78;
  int local_54;
  ulong local_50;
  
  AVar1 = pNtk1->ntkType;
  local_78 = pNtk1;
  if (AVar1 != ABC_NTK_STRASH) {
    local_78 = Abc_NtkStrash(pNtk1,0,0,0);
  }
  AVar2 = pNtk2->ntkType;
  if (AVar2 != ABC_NTK_STRASH) {
    pNtk2 = Abc_NtkStrash(pNtk2,0,0,0);
  }
  p = Sim_SimulateSeqModel(local_78,nFrames,pModel);
  p_00 = Sim_SimulateSeqModel(pNtk2,nFrames,pModel);
  if (nFrames < 1) {
    pObj = (Abc_Obj_t *)0x0;
    uVar11 = 0xffffffff;
    uVar15 = 0xffffffff;
    uVar10 = 0;
    local_50._0_4_ = -1;
    local_54 = -1;
  }
  else {
    iVar3 = local_78->vPos->nSize;
    local_54 = -1;
    uVar13 = 0;
    local_50 = 0xffffffff;
    uVar10 = 0;
    uVar15 = 0xffffffff;
    uVar11 = 0xffffffff;
    do {
      if (iVar3 < 1) {
        pObj = (Abc_Obj_t *)0x0;
      }
      else {
        uVar14 = pNtk2->vPos->nSize;
        if ((int)uVar14 < 1) {
          uVar14 = 0;
        }
        lVar12 = 0;
        pObj = (Abc_Obj_t *)0x0;
        do {
          if (uVar14 <= iVar3 - 1U) goto LAB_00320d9f;
          pAVar6 = (Abc_Obj_t *)local_78->vPos->pArray[lVar12];
          iVar4 = *(int *)((long)p->pArray[pAVar6->Id] + uVar13 * 4);
          iVar5 = *(int *)((long)p_00->pArray[*(int *)((long)pNtk2->vPos->pArray[lVar12] + 0x10)] +
                          uVar13 * 4);
          if ((iVar4 != iVar5) && (uVar10 = uVar10 + 1, pObj == (Abc_Obj_t *)0x0)) {
            uVar11 = (ulong)(iVar4 != 0);
            uVar15 = (ulong)(iVar5 != 0);
            local_50 = uVar13 & 0xffffffff;
            local_54 = (int)lVar12;
            pObj = pAVar6;
          }
          lVar12 = lVar12 + 1;
        } while (iVar3 != lVar12);
      }
      uVar13 = uVar13 + 1;
    } while ((uVar13 < (uint)nFrames) && (pObj == (Abc_Obj_t *)0x0));
  }
  if (pObj == (Abc_Obj_t *)0x0) {
    puts("No output mismatches detected.");
  }
  else {
    pcVar9 = "";
    if (1 < (int)uVar10) {
      pcVar9 = "s";
    }
    printf("Verification failed for at least %d output%s of frame %d: ",(ulong)uVar10,pcVar9);
    uVar14 = 0;
    pVVar8 = local_78->vPos;
    if (0 < pVVar8->nSize) {
      lVar12 = 0;
      uVar14 = 0;
      do {
        if (pNtk2->vPos->nSize <= lVar12) {
LAB_00320d9f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if (*(int *)((long)p->pArray[((Abc_Obj_t *)pVVar8->pArray[lVar12])->Id] +
                    (long)(int)local_50 * 4) !=
            *(int *)((long)p_00->pArray[*(int *)((long)pNtk2->vPos->pArray[lVar12] + 0x10)] +
                    (long)(int)local_50 * 4)) {
          pcVar9 = Abc_ObjName((Abc_Obj_t *)pVVar8->pArray[lVar12]);
          printf(" %s",pcVar9);
          uVar14 = uVar14 + 1;
          if (uVar14 == 3) {
            uVar14 = 3;
            break;
          }
        }
        lVar12 = lVar12 + 1;
        pVVar8 = local_78->vPos;
      } while (lVar12 < pVVar8->nSize);
    }
    if (uVar14 != uVar10) {
      printf(" ...");
    }
    putchar(10);
    Abc_NtkGetSeqPoSupp(local_78,(int)local_50,local_54);
    Abc_NtkGetSeqPoSupp(pNtk2,(int)local_50,local_54);
    pcVar9 = Abc_ObjName(pObj);
    printf("Output %s: Value in Network1 = %d. Value in Network2 = %d.\n",pcVar9,uVar11,uVar15);
    pcVar9 = Abc_ObjName(pObj);
    printf("The cone of influence of output %s in Network1:\n",pcVar9);
    printf("PIs: ");
    pVVar8 = local_78->vPis;
    if (0 < pVVar8->nSize) {
      lVar12 = 0;
      do {
        if ((((Abc_Obj_t *)pVVar8->pArray[lVar12])->field_6).pTemp != (void *)0x0) {
          pcVar9 = Abc_ObjName((Abc_Obj_t *)pVVar8->pArray[lVar12]);
          printf("%s ",pcVar9);
        }
        lVar12 = lVar12 + 1;
        pVVar8 = local_78->vPis;
      } while (lVar12 < pVVar8->nSize);
    }
    putchar(10);
    printf("Latches: ");
    pVVar8 = local_78->vBoxes;
    if (0 < pVVar8->nSize) {
      lVar12 = 0;
      do {
        pAVar6 = (Abc_Obj_t *)pVVar8->pArray[lVar12];
        if (((*(uint *)&pAVar6->field_0x14 & 0xf) == 8) && ((pAVar6->field_6).pTemp != (void *)0x0))
        {
          pcVar9 = Abc_ObjName(pAVar6);
          printf("%s ",pcVar9);
        }
        lVar12 = lVar12 + 1;
        pVVar8 = local_78->vBoxes;
      } while (lVar12 < pVVar8->nSize);
    }
    putchar(10);
    pcVar9 = Abc_ObjName(pObj);
    printf("The cone of influence of output %s in Network2:\n",pcVar9);
    printf("PIs: ");
    pVVar8 = pNtk2->vPis;
    if (0 < pVVar8->nSize) {
      lVar12 = 0;
      do {
        if ((((Abc_Obj_t *)pVVar8->pArray[lVar12])->field_6).pTemp != (void *)0x0) {
          pcVar9 = Abc_ObjName((Abc_Obj_t *)pVVar8->pArray[lVar12]);
          printf("%s ",pcVar9);
        }
        lVar12 = lVar12 + 1;
        pVVar8 = pNtk2->vPis;
      } while (lVar12 < pVVar8->nSize);
    }
    putchar(10);
    printf("Latches: ");
    pVVar8 = pNtk2->vBoxes;
    if (0 < pVVar8->nSize) {
      lVar12 = 0;
      do {
        pAVar6 = (Abc_Obj_t *)pVVar8->pArray[lVar12];
        if (((*(uint *)&pAVar6->field_0x14 & 0xf) == 8) && ((pAVar6->field_6).pTemp != (void *)0x0))
        {
          pcVar9 = Abc_ObjName(pAVar6);
          printf("%s ",pcVar9);
        }
        lVar12 = lVar12 + 1;
        pVVar8 = pNtk2->vBoxes;
      } while (lVar12 < pVVar8->nSize);
    }
    putchar(10);
    if (-1 < (int)local_50) {
      uVar11 = 0;
      do {
        uVar15 = uVar11 + 1;
        printf("Frame %d:  ",uVar15 & 0xffffffff);
        printf("PI(1):");
        pVVar8 = local_78->vPis;
        if (0 < pVVar8->nSize) {
          lVar12 = 0;
          do {
            if (*(long *)((long)pVVar8->pArray[lVar12] + 0x40) != 0) {
              printf("%d",(ulong)(*(int *)((long)p->pArray[*(int *)((long)pVVar8->pArray[lVar12] +
                                                                   0x10)] + uVar11 * 4) != 0));
            }
            lVar12 = lVar12 + 1;
            pVVar8 = local_78->vPis;
          } while (lVar12 < pVVar8->nSize);
        }
        putchar(0x20);
        printf("L(1):");
        pVVar8 = local_78->vBoxes;
        if (0 < pVVar8->nSize) {
          lVar12 = 0;
          do {
            pvVar7 = pVVar8->pArray[lVar12];
            if (((*(uint *)((long)pvVar7 + 0x14) & 0xf) == 8) &&
               (*(long *)((long)pvVar7 + 0x40) != 0)) {
              printf("%d",(ulong)(*(int *)((long)p->pArray[*(int *)((long)pvVar7 + 0x10)] +
                                          uVar11 * 4) != 0));
            }
            lVar12 = lVar12 + 1;
            pVVar8 = local_78->vBoxes;
          } while (lVar12 < pVVar8->nSize);
        }
        putchar(0x20);
        pcVar9 = Abc_ObjName(pObj);
        printf("%s(1):",pcVar9);
        printf("%d",(ulong)(*(int *)((long)p->pArray[pObj->Id] + uVar11 * 4) != 0));
        printf("  ");
        printf("PI(2):");
        pVVar8 = pNtk2->vPis;
        if (0 < pVVar8->nSize) {
          lVar12 = 0;
          do {
            if (*(long *)((long)pVVar8->pArray[lVar12] + 0x40) != 0) {
              printf("%d",(ulong)(*(int *)((long)p_00->pArray
                                                 [*(int *)((long)pVVar8->pArray[lVar12] + 0x10)] +
                                          uVar11 * 4) != 0));
            }
            lVar12 = lVar12 + 1;
            pVVar8 = pNtk2->vPis;
          } while (lVar12 < pVVar8->nSize);
        }
        putchar(0x20);
        printf("L(2):");
        pVVar8 = pNtk2->vBoxes;
        if (0 < pVVar8->nSize) {
          lVar12 = 0;
          do {
            pvVar7 = pVVar8->pArray[lVar12];
            if (((*(uint *)((long)pvVar7 + 0x14) & 0xf) == 8) &&
               (*(long *)((long)pvVar7 + 0x40) != 0)) {
              printf("%d",(ulong)(*(int *)((long)p_00->pArray[*(int *)((long)pvVar7 + 0x10)] +
                                          uVar11 * 4) != 0));
            }
            lVar12 = lVar12 + 1;
            pVVar8 = pNtk2->vBoxes;
          } while (lVar12 < pVVar8->nSize);
        }
        putchar(0x20);
        pcVar9 = Abc_ObjName(pObj);
        printf("%s(2):",pcVar9);
        printf("%d",(ulong)(*(int *)((long)p_00->pArray[pObj->Id] + uVar11 * 4) != 0));
        putchar(10);
        uVar11 = uVar15;
      } while (uVar15 != (int)local_50 + 1);
    }
    pVVar8 = local_78->vCis;
    if (0 < pVVar8->nSize) {
      lVar12 = 0;
      do {
        *(undefined8 *)((long)pVVar8->pArray[lVar12] + 0x40) = 0;
        lVar12 = lVar12 + 1;
        pVVar8 = local_78->vCis;
      } while (lVar12 < pVVar8->nSize);
    }
    pVVar8 = pNtk2->vCis;
    if (0 < pVVar8->nSize) {
      lVar12 = 0;
      do {
        *(undefined8 *)((long)pVVar8->pArray[lVar12] + 0x40) = 0;
        lVar12 = lVar12 + 1;
        pVVar8 = pNtk2->vCis;
      } while (lVar12 < pVVar8->nSize);
    }
  }
  Sim_UtilInfoFree(p);
  Sim_UtilInfoFree(p_00);
  if (AVar1 != ABC_NTK_STRASH) {
    Abc_NtkDelete(local_78);
  }
  if (AVar2 != ABC_NTK_STRASH) {
    Abc_NtkDelete(pNtk2);
    return;
  }
  return;
}

Assistant:

void Abc_NtkVerifyReportErrorSeq( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int * pModel, int nFrames )
{
    Vec_Ptr_t * vInfo1, * vInfo2;
    Abc_Obj_t * pObj, * pObjError, * pObj1, * pObj2;
    int ValueError1 = -1, ValueError2 = -1;
    unsigned * pPats1, * pPats2;
    int i, o, k, nErrors, iFrameError = -1, iNodePo = -1, nPrinted;
    int fRemove1 = 0, fRemove2 = 0;

    if ( !Abc_NtkIsStrash(pNtk1) )
        fRemove1 = 1, pNtk1 = Abc_NtkStrash( pNtk1, 0, 0, 0 );
    if ( !Abc_NtkIsStrash(pNtk2) )
        fRemove2 = 1, pNtk2 = Abc_NtkStrash( pNtk2, 0, 0, 0 );

    // simulate sequential circuits
    vInfo1 = Sim_SimulateSeqModel( pNtk1, nFrames, pModel );
    vInfo2 = Sim_SimulateSeqModel( pNtk2, nFrames, pModel );

    // look for a discrepancy in the PO values
    nErrors = 0;
    pObjError = NULL;
    for ( i = 0; i < nFrames; i++ )
    {
        if ( pObjError )
            break;
        Abc_NtkForEachPo( pNtk1, pObj1, o )
        {
            pObj2  = Abc_NtkPo( pNtk2, o );
            pPats1 = Sim_SimInfoGet(vInfo1, pObj1);
            pPats2 = Sim_SimInfoGet(vInfo2, pObj2);
            if ( pPats1[i] == pPats2[i] )
                continue;
            nErrors++;
            if ( pObjError == NULL )
            {
                pObjError   = pObj1;
                iFrameError = i;
                iNodePo     = o;
                ValueError1 = (pPats1[i] > 0);
                ValueError2 = (pPats2[i] > 0);
            }
        }
    }

    if ( pObjError == NULL )
    {
        printf( "No output mismatches detected.\n" );
        Sim_UtilInfoFree( vInfo1 );
        Sim_UtilInfoFree( vInfo2 );
        if ( fRemove1 ) Abc_NtkDelete( pNtk1 );
        if ( fRemove2 ) Abc_NtkDelete( pNtk2 );
        return;
    }

    printf( "Verification failed for at least %d output%s of frame %d: ", nErrors, (nErrors>1? "s":""), iFrameError+1 );
    // print the first 3 outputs
    nPrinted = 0;
    Abc_NtkForEachPo( pNtk1, pObj1, o )
    {
        pObj2 = Abc_NtkPo( pNtk2, o );
        pPats1 = Sim_SimInfoGet(vInfo1, pObj1);
        pPats2 = Sim_SimInfoGet(vInfo2, pObj2);
        if ( pPats1[iFrameError] == pPats2[iFrameError] )
            continue;
        printf( " %s", Abc_ObjName(pObj1) );
        if ( ++nPrinted == 3 )
            break;
    }
    if ( nPrinted != nErrors )
        printf( " ..." );
    printf( "\n" );

    // mark CIs of the networks in the cone of influence of this output
    Abc_NtkGetSeqPoSupp( pNtk1, iFrameError, iNodePo );
    Abc_NtkGetSeqPoSupp( pNtk2, iFrameError, iNodePo );

    // report mismatch for the first output
    printf( "Output %s: Value in Network1 = %d. Value in Network2 = %d.\n", 
        Abc_ObjName(pObjError), ValueError1, ValueError2 );

    printf( "The cone of influence of output %s in Network1:\n", Abc_ObjName(pObjError) );
    printf( "PIs: " );
    Abc_NtkForEachPi( pNtk1, pObj, i )
        if ( pObj->pCopy )
            printf( "%s ", Abc_ObjName(pObj) );
    printf( "\n" );
    printf( "Latches: " );
    Abc_NtkForEachLatch( pNtk1, pObj, i )
        if ( pObj->pCopy )
            printf( "%s ", Abc_ObjName(pObj) );
    printf( "\n" );

    printf( "The cone of influence of output %s in Network2:\n", Abc_ObjName(pObjError) );
    printf( "PIs: " );
    Abc_NtkForEachPi( pNtk2, pObj, i )
        if ( pObj->pCopy )
            printf( "%s ", Abc_ObjName(pObj) );
    printf( "\n" );
    printf( "Latches: " );
    Abc_NtkForEachLatch( pNtk2, pObj, i )
        if ( pObj->pCopy )
            printf( "%s ", Abc_ObjName(pObj) );
    printf( "\n" );

    // print the patterns
    for ( i = 0; i <= iFrameError; i++ )
    {
        printf( "Frame %d:  ", i+1 );

        printf( "PI(1):" );
        Abc_NtkForEachPi( pNtk1, pObj, k )
            if ( pObj->pCopy )
                printf( "%d", Sim_SimInfoGet(vInfo1, pObj)[i] > 0 );
        printf( " " );
        printf( "L(1):" );
        Abc_NtkForEachLatch( pNtk1, pObj, k )
            if ( pObj->pCopy )
                printf( "%d", Sim_SimInfoGet(vInfo1, pObj)[i] > 0 );
        printf( " " );
        printf( "%s(1):", Abc_ObjName(pObjError) );
        printf( "%d", Sim_SimInfoGet(vInfo1, pObjError)[i] > 0 );

        printf( "  " );

        printf( "PI(2):" );
        Abc_NtkForEachPi( pNtk2, pObj, k )
            if ( pObj->pCopy )
                printf( "%d", Sim_SimInfoGet(vInfo2, pObj)[i] > 0 );
        printf( " " );
        printf( "L(2):" );
        Abc_NtkForEachLatch( pNtk2, pObj, k )
            if ( pObj->pCopy )
                printf( "%d", Sim_SimInfoGet(vInfo2, pObj)[i] > 0 );
        printf( " " );
        printf( "%s(2):", Abc_ObjName(pObjError) );
        printf( "%d", Sim_SimInfoGet(vInfo2, pObjError)[i] > 0 );

        printf( "\n" );
    }
    Abc_NtkForEachCi( pNtk1, pObj, i )
        pObj->pCopy = NULL;
    Abc_NtkForEachCi( pNtk2, pObj, i )
        pObj->pCopy = NULL;

    Sim_UtilInfoFree( vInfo1 );
    Sim_UtilInfoFree( vInfo2 );
    if ( fRemove1 ) Abc_NtkDelete( pNtk1 );
    if ( fRemove2 ) Abc_NtkDelete( pNtk2 );
}